

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O0

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
::GroupByState(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
               *this,IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>
                     *in,function<bool_(const_int_&)> *transformer)

{
  function<bool_(const_int_&)> *transformer_local;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *in_local;
  GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
  *this_local;
  
  IState<linq::IGrouping<bool,_int_&>_>::IState(&this->super_IState<linq::IGrouping<bool,_int_&>_>);
  (this->super_IState<linq::IGrouping<bool,_int_&>_>)._vptr_IState =
       (_func_int **)&PTR_Init_001755c0;
  IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::
  IEnumerableCore(&this->source,in);
  std::function<bool_(const_int_&)>::function(&this->transformer,transformer);
  std::
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map(&this->result);
  std::_Rb_tree_iterator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>::
  _Rb_tree_iterator(&this->current);
  return;
}

Assistant:

GroupByState(S&& in, const std::function<KEY(const VALUE&)>& transformer) 
				: source(in), transformer(transformer)
			{
			}